

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::ConvertToRgb(uint8_t *outY,uint8_t *outYEnd,uint8_t *inY,uint32_t rowSizeOut,
                      uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,
                      uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 (*pauVar5) [16];
  undefined3 in_register_00000089;
  uint uVar6;
  void *__s;
  uint8_t *puVar7;
  ulong uVar8;
  
  uVar6 = CONCAT31(in_register_00000089,colorCount);
  puVar7 = inY + totalSimdWidth;
  for (; outY != outYEnd; outY = *(undefined1 (*) [16])outY + rowSizeOut) {
    lVar4 = 0;
    pauVar5 = (undefined1 (*) [16])outY;
    while ((ulong)simdWidth << 4 != lVar4) {
      auVar1 = *(undefined1 (*) [16])(inY + lVar4);
      lVar4 = lVar4 + 0x10;
      auVar2 = vpshufb_avx(auVar1,_DAT_0011d640);
      auVar3 = vpshufb_avx(auVar1,_DAT_0011d650);
      auVar1 = vpshufb_avx(auVar1,_DAT_0011d660);
      *pauVar5 = auVar2;
      pauVar5[1] = auVar3;
      pauVar5[2] = auVar1;
      pauVar5 = pauVar5 + 3;
    }
    if (nonSimdWidth != 0) {
      __s = *(undefined1 (*) [16])outY + totalSimdWidth * uVar6;
      for (uVar8 = 0; nonSimdWidth != uVar8; uVar8 = uVar8 + 1) {
        memset(__s,(uint)puVar7[uVar8],(ulong)uVar6);
        __s = (void *)((long)__s + (ulong)uVar6);
      }
    }
    inY = inY + rowSizeIn;
    puVar7 = puVar7 + rowSizeIn;
  }
  return;
}

Assistant:

void ConvertToRgb( uint8_t * outY, const uint8_t * outYEnd, const uint8_t * inY, uint32_t rowSizeOut, uint32_t rowSizeIn,
                       uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl1 = _mm_setr_epi8( 0, 0, 0, 1, 1, 1, 2, 2, 2, 3, 3, 3, 4, 4, 4, 5 );
        const simd ctrl2 = _mm_setr_epi8( 5, 5, 6, 6, 6, 7, 7, 7, 8, 8, 8, 9, 9, 9, 10, 10 );
        const simd ctrl3 = _mm_setr_epi8( 10, 11, 11, 11, 12, 12, 12, 13, 13, 13, 14, 14, 14, 15, 15, 15 );
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src = reinterpret_cast<const simd*>(inY);
            simd       * dst = reinterpret_cast<simd*>(outY);

            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                const simd src1 = _mm_loadu_si128( src );

                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl1 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl2 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl3 ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth*colorCount;

                const uint8_t * inXEnd = inX + nonSimdWidth;

                for( ; inX != inXEnd; outX += colorCount, ++inX )
                    memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
            }
        }
    }